

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot_playground.cpp
# Opt level: O3

fsm_def * fsm_from_file(fsm_def *__return_storage_ptr__,path *input_file_path)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  _Alloc_hider _Var4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  input_iterator_type OuterIt;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  long lVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string transistions_chunk;
  string line;
  ifstream file;
  is_classifiedF local_2c8;
  long local_2b8;
  long lStack_2b0;
  ulong local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  fsm_def *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_280 = __return_storage_ptr__;
  fsm_def::fsm_def(__return_storage_ptr__);
  std::ifstream::ifstream(local_238,(string *)input_file_path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to open file: ",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(input_file_path->m_pathname)._M_dataplus._M_p,
                        (input_file_path->m_pathname)._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading statemachine from: ",0x1b);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(input_file_path->m_pathname)._M_dataplus._M_p,
                      (input_file_path->m_pathname)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
  lVar6 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar6] & 2) != 0) {
LAB_00105eed:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_238);
    return local_280;
  }
  local_2a8 = 0;
LAB_00105ab1:
  cVar1 = std::ios::widen((char)&local_2c8 + (char)lVar6 + -0x70);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_258,cVar1);
  std::locale::locale((locale *)&local_278);
  local_2c8.m_Type = 0x2000;
  std::locale::locale(&local_2c8.m_Locale,(locale *)&local_278);
  boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
            (&local_258,&local_2c8);
  std::locale::~locale(&local_2c8.m_Locale);
  std::locale::~locale((locale *)&local_278);
  if (local_258._M_string_length == 0) goto LAB_00105ccd;
  _Var4._M_p = local_258._M_dataplus._M_p + local_258._M_string_length;
  lVar6 = local_258._M_string_length - 1;
  lVar7 = lVar6;
  _Var10._M_p = local_258._M_dataplus._M_p;
  do {
    lVar8 = 0;
    do {
      lVar11 = lVar8;
      if ((_Var10._M_p[lVar8] != ".transitions_from"[lVar8]) || (lVar11 = lVar8 + 1, lVar7 == lVar8)
         ) break;
      bVar12 = lVar8 != 0x10;
      lVar8 = lVar11;
    } while (bVar12);
    lVar8 = lVar6;
    _Var9._M_p = local_258._M_dataplus._M_p;
    if (lVar11 == 0x11) {
      if (_Var10._M_p != _Var10._M_p + lVar11) {
        if ((local_2a8 & 1) != 0) {
          if (local_2a0._M_string_length != 0) {
            std::operator+(&local_278,"   ",&local_2a0);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_278);
            plVar5 = plVar3 + 2;
            if ((long *)*plVar3 == plVar5) {
              local_2b8 = *plVar5;
              lStack_2b0 = plVar3[3];
              local_2c8._0_8_ = &local_2b8;
            }
            else {
              local_2b8 = *plVar5;
              local_2c8._0_8_ = (long *)*plVar3;
            }
            local_2c8._8_8_ = plVar3[1];
            *plVar3 = (long)plVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_2c8);
            if ((long *)local_2c8._0_8_ != &local_2b8) {
              operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (local_280,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_2a0._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_2a0._M_dataplus._M_p + local_2a0._M_string_length));
          }
          local_2a0._M_string_length = 0;
          *local_2a0._M_dataplus._M_p = '\0';
          _Var4._M_p = local_2a0._M_dataplus._M_p;
        }
        local_2a8 = CONCAT71((int7)((ulong)_Var4._M_p >> 8),1);
        goto LAB_00105e85;
      }
      break;
    }
    _Var10._M_p = _Var10._M_p + 1;
    lVar7 = lVar7 + -1;
  } while (_Var10._M_p != _Var4._M_p);
  do {
    lVar7 = 0;
    do {
      lVar11 = lVar7;
      if ((_Var9._M_p[lVar7] != ".end_transitions"[lVar7]) || (lVar11 = lVar7 + 1, lVar8 == lVar7))
      break;
      bVar12 = lVar7 != 0xf;
      lVar7 = lVar11;
    } while (bVar12);
    _Var10._M_p = local_258._M_dataplus._M_p;
    if (lVar11 == 0x10) {
      if (_Var9._M_p != _Var9._M_p + lVar11) goto LAB_00105c7c;
      break;
    }
    _Var9._M_p = _Var9._M_p + 1;
    lVar8 = lVar8 + -1;
  } while (_Var9._M_p != _Var4._M_p);
  do {
    lVar7 = 0;
    do {
      lVar8 = lVar7;
      if ((_Var10._M_p[lVar7] != ".otherwise_loop"[lVar7]) || (lVar8 = lVar7 + 1, lVar6 == lVar7))
      break;
      bVar12 = lVar7 != 0xe;
      lVar7 = lVar8;
    } while (bVar12);
    if (lVar8 == 0xf) {
      if (_Var10._M_p != _Var10._M_p + lVar8) goto LAB_00105c7c;
      break;
    }
    _Var10._M_p = _Var10._M_p + 1;
    lVar6 = lVar6 + -1;
  } while (_Var10._M_p != _Var4._M_p);
  if ((local_2a8 & 1) != 0) {
LAB_00105e85:
    if (local_258._M_string_length != 0) {
      local_2c8._0_8_ = &local_2b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,local_258._M_dataplus._M_p,
                 local_258._M_dataplus._M_p + local_258._M_string_length);
      std::__cxx11::string::append((char *)&local_2c8);
      std::__cxx11::string::_M_append((char *)&local_2a0,local_2c8._0_8_);
      if ((long *)local_2c8._0_8_ != &local_2b8) {
        operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
      }
    }
  }
  goto LAB_00105dc7;
LAB_00105c7c:
  local_2c8._0_8_ = &local_2b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_258._M_dataplus._M_p,_Var4._M_p);
  std::__cxx11::string::append((char *)&local_2c8);
  std::__cxx11::string::_M_append((char *)&local_2a0,local_2c8._0_8_);
  if ((long *)local_2c8._0_8_ != &local_2b8) {
    operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
  }
LAB_00105ccd:
  if (local_2a0._M_string_length != 0) {
    std::operator+(&local_278,"   ",&local_2a0);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_278);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_2b8 = *plVar5;
      lStack_2b0 = plVar3[3];
      local_2c8._0_8_ = &local_2b8;
    }
    else {
      local_2b8 = *plVar5;
      local_2c8._0_8_ = (long *)*plVar3;
    }
    local_2c8._8_8_ = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_2c8);
    if ((long *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (local_280,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_2a0._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_2a0._M_dataplus._M_p + local_2a0._M_string_length));
  }
  local_2a0._M_string_length = 0;
  *local_2a0._M_dataplus._M_p = '\0';
  local_2a8 = 0;
LAB_00105dc7:
  lVar6 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar6] & 2) != 0) goto LAB_00105eed;
  goto LAB_00105ab1;
}

Assistant:

fsm_def fsm_from_file(const boost::filesystem::path& input_file_path)
{
    namespace ba = boost::algorithm;
    fsm_def sm;
    std::ifstream file (input_file_path.native());
    if (file.is_open()) {
        std::cout << "Reading statemachine from: " << input_file_path.native() << std::endl;
        std::string line;
        std::string transistions_chunk ("");
        bool in_transistions_chunk = false;
        while (!file.eof()) {
            std::getline(file, line);
            boost::algorithm::trim(line);
            if (ba::contains(line, ".transitions_from")) {
                if (in_transistions_chunk) {
                    if (!transistions_chunk.empty()) {
                        transistions_chunk = "   " + transistions_chunk + "  ;";
//                        std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                        parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                    }
                    transistions_chunk.clear();
                }
                in_transistions_chunk = true;
            }
            else if ( ba::contains(line, ".end_transitions") ||
                 ba::contains(line, ".otherwise_loop") ||
                 line.empty()
               ) {
                in_transistions_chunk = false;
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
                if (!transistions_chunk.empty()) {
                    transistions_chunk = "   " + transistions_chunk + "  ;";
//                    std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                    parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                }
                transistions_chunk.clear();
            }
            if (in_transistions_chunk) {
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
            }
        }
    }
    else {
        std::cout << "Unable to open file: " << input_file_path.native() << std::endl;
        exit(1);
    }

    return sm;
}